

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall BVSparse<Memory::Recycler>::ClearAll(BVSparse<Memory::Recycler> *this)

{
  BVSparseNode<Memory::Recycler> **ppBVar1;
  nullptr_t local_30;
  nullptr_t local_28;
  BVSparseNode<Memory::Recycler> *local_20;
  BVSparseNode *node;
  BVSparseNode *nextNode;
  BVSparse<Memory::Recycler> *this_local;
  
  nextNode = (BVSparseNode *)this;
  ppBVar1 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)this);
  local_20 = *ppBVar1;
  while (local_20 != (BVSparseNode<Memory::Recycler> *)0x0) {
    ppBVar1 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)local_20);
    node = *ppBVar1;
    QueueInFreeList(this,local_20);
    local_20 = node;
  }
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=(&this->head,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=
            (&this->lastFoundIndex,&local_30);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>_>::operator=
            (&this->lastUsedNodePrevNextField,&this->head);
  return;
}

Assistant:

void
BVSparse<TAllocator>::ClearAll()
{
    BVSparseNode* nextNode;
    for(BVSparseNode * node = this->head; node != 0 ; node = nextNode)
    {
        nextNode = node->next;
        QueueInFreeList(node);
    }
    this->head = nullptr;
    this->lastFoundIndex = nullptr;
    this->lastUsedNodePrevNextField = &this->head;
}